

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

void __thiscall libebml::EbmlMaster::EbmlMaster(EbmlMaster *this,EbmlMaster *ElementToClone)

{
  allocator<libebml::EbmlElement_*> *this_00;
  bool bVar1;
  int iVar2;
  size_t __n;
  reference ppEVar3;
  undefined4 extraout_var;
  reference ppEVar4;
  __normal_iterator<libebml::EbmlElement_*const_*,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
  local_40;
  __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
  local_38;
  iterator myItr;
  const_iterator Itr;
  EbmlMaster *ElementToClone_local;
  EbmlMaster *this_local;
  
  EbmlElement::EbmlElement(&this->super_EbmlElement,&ElementToClone->super_EbmlElement);
  (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlMaster_00236760;
  __n = ListSize(ElementToClone);
  this_00 = (allocator<libebml::EbmlElement_*> *)((long)&Itr._M_current + 3);
  std::allocator<libebml::EbmlElement_*>::allocator(this_00);
  std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::vector
            (&this->ElementList,__n,this_00);
  std::allocator<libebml::EbmlElement_*>::~allocator
            ((allocator<libebml::EbmlElement_*> *)((long)&Itr._M_current + 3));
  this->Context = ElementToClone->Context;
  this->bChecksumUsed = (bool)(ElementToClone->bChecksumUsed & 1);
  EbmlCrc32::EbmlCrc32(&this->Checksum,&ElementToClone->Checksum);
  myItr._M_current =
       (EbmlElement **)
       std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::begin
                 (&ElementToClone->ElementList);
  local_38._M_current =
       (EbmlElement **)
       std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::begin
                 (&this->ElementList);
  while( true ) {
    local_40._M_current =
         (EbmlElement **)
         std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::end
                   (&ElementToClone->ElementList);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<libebml::EbmlElement_*const_*,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
                        *)&myItr,&local_40);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<libebml::EbmlElement_*const_*,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
              ::operator*((__normal_iterator<libebml::EbmlElement_*const_*,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
                           *)&myItr);
    iVar2 = (*(*ppEVar3)->_vptr_EbmlElement[2])();
    ppEVar4 = __gnu_cxx::
              __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
              ::operator*(&local_38);
    *ppEVar4 = (EbmlElement *)CONCAT44(extraout_var,iVar2);
    __gnu_cxx::
    __normal_iterator<libebml::EbmlElement_*const_*,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
    ::operator++((__normal_iterator<libebml::EbmlElement_*const_*,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
                  *)&myItr);
    __gnu_cxx::
    __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

EbmlMaster::EbmlMaster(const EbmlMaster & ElementToClone)
 :EbmlElement(ElementToClone)
 ,ElementList(ElementToClone.ListSize())
 ,Context(ElementToClone.Context)
 ,bChecksumUsed(ElementToClone.bChecksumUsed)
 ,Checksum(ElementToClone.Checksum)
{
  // add a clone of the list
  std::vector<EbmlElement *>::const_iterator Itr = ElementToClone.ElementList.begin();
  std::vector<EbmlElement *>::iterator myItr = ElementList.begin();
  while (Itr != ElementToClone.ElementList.end())
  {
    *myItr = (*Itr)->Clone();
    ++Itr; ++myItr;
  }

}